

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.hpp
# Opt level: O2

void __thiscall trng::yarn2::jump2(yarn2 *this,uint s)

{
  int32_t (*a) [4];
  uint uVar1;
  int32_t (*a_00) [4];
  result_type d [2];
  result_type c [4];
  status_type local_58;
  int32_t local_50 [2];
  int32_t local_48 [4];
  undefined8 local_38;
  undefined8 local_30;
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_38 = *(undefined8 *)(this->P).a;
  a = (int32_t (*) [4])(local_48 + 4);
  local_30 = 1;
  for (uVar1 = 0; uVar1 < s; uVar1 = uVar1 + 2) {
    int_math::matrix_mult<2>(a,a,&local_48,0x7fffffff);
    if (s <= uVar1 + 1) break;
    int_math::matrix_mult<2>(&local_48,&local_48,a,0x7fffffff);
  }
  local_50 = *(int32_t (*) [2])(this->S).r;
  a_00 = &local_48;
  if ((s & 1) == 0) {
    a_00 = a;
  }
  int_math::matrix_vec_mult<2>(a_00,&local_50,local_58.r,0x7fffffff);
  *&(this->S).r = local_58.r;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn2::jump2(unsigned int s) {
    result_type b[4], c[4]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = 1;
    b[3] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<2>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<2>(c, c, b, modulus);
    }
    const result_type r[2]{S.r[0], S.r[1]};
    result_type d[2];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<2>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<2>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
  }